

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O2

int is_from_client(sockaddr *addr)

{
  int iVar1;
  int64_t eval_b;
  char dst [256];
  
  if (addr != (sockaddr *)0x0) {
    dst._0_8_ = ZEXT28(addr->sa_family);
    if (dst._0_8_ != 10) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-ipv6.c"
              ,0x5f,"addr->sa_family","==","10",dst._0_8_,"==",10);
      abort();
    }
    iVar1 = uv_inet_ntop((uint)addr->sa_family,addr->sa_data + 6,dst,0x100);
    if (iVar1 != 0) {
      return 0;
    }
    printf("from [%.*s]:%d\n",0x100,dst,(ulong)*(ushort *)addr->sa_data);
    if (*(uint16_t *)addr->sa_data != client_port) {
      return 0;
    }
    iVar1 = bcmp(dst,"::ffff:127.0.0.1",0x11);
    if (iVar1 != 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int is_from_client(const struct sockaddr* addr) {
  const struct sockaddr_in6* addr6;
  char dst[256];
  int r;

  /* Debugging output, and filter out unwanted network traffic */
  if (addr != NULL) {
    ASSERT_EQ(addr->sa_family, AF_INET6);
    addr6 = (struct sockaddr_in6*) addr;
    r = uv_inet_ntop(addr->sa_family, &addr6->sin6_addr, dst, sizeof(dst));
    if (r == 0)
      printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr6->sin6_port);
    if (addr6->sin6_port != client_port)
      return 0;
    if (r != 0 || strcmp(dst, "::ffff:127.0.0.1"))
      return 0;
  }
  return 1;
}